

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QHeaderViewPrivate::SectionItem>>
          (QDataStream *s,QList<QHeaderViewPrivate::SectionItem> *c)

{
  qint64 asize;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  long in_FS_OFFSET;
  bool bVar1;
  SectionItem local_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<QHeaderViewPrivate::SectionItem>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QHeaderViewPrivate::SectionItem>::reserve(c,asize);
    __buf = extraout_RDX;
    while (bVar1 = asize != 0, asize = asize + -1, bVar1) {
      local_50 = (SectionItem)0xaaaaaaaaa8000000;
      QHeaderViewPrivate::SectionItem::read(&local_50,(Status)s,__buf,in_RCX);
      if (s[0x13] != (QDataStream)0x0) {
        QList<QHeaderViewPrivate::SectionItem>::clear(c);
        break;
      }
      QList<QHeaderViewPrivate::SectionItem>::emplaceBack<QHeaderViewPrivate::SectionItem_const&>
                (c,&local_50);
      __buf = extraout_RDX_00;
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}